

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void tests::to_dot(void)

{
  undefined8 *puVar1;
  N *pNVar2;
  void *pvVar3;
  ostream *poVar4;
  NS *pNVar5;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  N *n7;
  N *n6;
  N *n5;
  N *n4;
  N *n3;
  N *n2;
  N *n1;
  N *p2;
  N *p1;
  N *has;
  N *p;
  NS *g;
  NS *in_stack_fffffffffffffd98;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  N *in_stack_fffffffffffffdb0;
  N *this;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffe40;
  Alg<void> *in_stack_fffffffffffffe48;
  N *in_stack_fffffffffffffe50;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  N *local_120;
  sockaddr *local_118;
  undefined8 local_110;
  N *local_108;
  sockaddr *local_100;
  undefined8 local_f8;
  N *local_f0;
  sockaddr *local_e8;
  undefined8 local_e0;
  void *local_d8;
  N *local_d0;
  sockaddr *local_c8;
  undefined8 local_c0;
  N *local_b8;
  void *local_b0;
  sockaddr *local_a8;
  undefined8 local_a0;
  void *local_98;
  sockaddr *local_90;
  undefined8 local_88;
  void *local_80;
  void *local_78;
  sockaddr *local_70;
  undefined8 local_68;
  N *local_60;
  N *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  N *local_38;
  N *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  N *local_10;
  undefined8 *local_8;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  NS::NS((NS *)0x17b1ac);
  local_8 = puVar1;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_10 = pNVar2;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_18 = pvVar3;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_20 = pvVar3;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_28 = pvVar3;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_30 = pNVar2;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_38 = pNVar2;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_40 = pvVar3;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_48 = pvVar3;
  pvVar3 = N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_50 = pvVar3;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_58 = pNVar2;
  pNVar2 = (N *)N::operator_new((size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  N::N<char_const*>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  local_80 = local_20;
  local_78 = local_28;
  local_70 = (sockaddr *)&local_80;
  local_68 = 2;
  local_60 = pNVar2;
  N::connect(local_10,(int)local_18,local_70,2);
  local_98 = local_48;
  local_90 = (sockaddr *)&local_98;
  local_88 = 1;
  N::connect(local_30,(int)local_28,local_90,1);
  local_b8 = local_38;
  local_b0 = local_40;
  local_a8 = (sockaddr *)&local_b8;
  local_a0 = 2;
  N::connect(local_30,(int)local_20,local_a8,2);
  local_d8 = local_50;
  local_d0 = local_58;
  local_c8 = (sockaddr *)&local_d8;
  local_c0 = 2;
  N::connect(local_38,(int)local_20,local_c8,2);
  local_f0 = local_60;
  local_e8 = (sockaddr *)&local_f0;
  local_e0 = 1;
  N::connect(local_58,(int)local_20,local_e8,1);
  local_108 = local_60;
  local_100 = (sockaddr *)&local_108;
  local_f8 = 1;
  N::connect(local_58,(int)local_28,local_100,1);
  local_120 = local_38;
  local_118 = (sockaddr *)&local_120;
  local_110 = 1;
  N::connect(local_60,(int)local_20,local_118,1);
  std::set<N_*,_std::less<N_*>,_std::allocator<N_*>_>::set
            ((set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)0x17b690);
  poVar4 = std::operator<<((ostream *)&std::cout,"digraph T {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  this = local_30;
  alg::dot(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  poVar4 = (ostream *)&local_198;
  std::vector<N_*,_std::allocator<N_*>_>::vector((vector<N_*,_std::allocator<N_*>_> *)0x17b717);
  N::histo(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::vector<N_*,_std::allocator<N_*>_>::~vector
            ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffda0);
  std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::~function
            ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)0x17b74a);
  pNVar2 = local_10;
  alg::dot(poVar4,(set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)local_10);
  std::vector<N_*,_std::allocator<N_*>_>::vector((vector<N_*,_std::allocator<N_*>_> *)0x17b79e);
  N::histo(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::vector<N_*,_std::allocator<N_*>_>::~vector((vector<N_*,_std::allocator<N_*>_> *)pNVar2);
  std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::~function
            ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)0x17b7d1);
  poVar4 = std::operator<<((ostream *)&std::cout,"}");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pNVar5 = NS::clear((NS *)this);
  if (pNVar5 != (NS *)0x0) {
    NS::~NS((NS *)0x17b824);
    operator_delete(pNVar5,0x18);
  }
  std::set<N_*,_std::less<N_*>,_std::allocator<N_*>_>::~set
            ((set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)0x17b83f);
  return;
}

Assistant:

void to_dot() {
        auto g = new NS();

        auto p = new(g) N("p"), has = new(g) N("has instance");
        auto p1 = new(g) N("p1"), p2 = new(g) N("p2");
        auto n1 = new(g) N("A"), n2 = new(g) N("B"), n3 = new(g) N("C"), n4 = new(g) N("D");
        auto n5 = new(g) N("BA"), n6 = new(g) N("BB");
        auto n7 = new(g) N("BBB");

        p->connect(has, {p1, p2});

        n1->connect(p2, {n4});
        n1->connect(p1, {n2, n3});
        n2->connect(p1, {n5, n6});
        n6->connect(p1, {n7});
        n6->connect(p2, {n7});

        n7->connect(p1, {n2});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        p->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }